

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

bool __thiscall Code::checkExtremalVertex(Code *this,int vertexIndex,string *direction)

{
  bool bVar1;
  bool bVar2;
  mapped_type *this_00;
  reference piVar3;
  reference pvVar4;
  iterator __first;
  iterator __last;
  int in_ESI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  int edgeIndex;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  bool edgeInSyndrome;
  value_type *edges;
  value_type *upEdges;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  iterator in_stack_ffffffffffffff88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffb8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
            ::operator[](in_stack_ffffffffffffffc0,(key_type *)in_stack_ffffffffffffffb8._M_current)
  ;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator[](this_00,(long)in_ESI);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)(in_RDI + 0x1c),(long)in_ESI);
  bVar1 = false;
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff78);
    if (!bVar2) {
      return bVar1;
    }
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &stack0xffffffffffffffb8);
    pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 3),
                        (long)*piVar3);
    if (*pvVar4 == '\x01') {
      bVar1 = true;
      __first = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
      __last = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
      std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 __first._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 __last._M_current,in_stack_ffffffffffffff88._M_current);
      in_stack_ffffffffffffff88 =
           std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
      bVar2 = __gnu_cxx::operator==
                        (in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_ffffffffffffff78);
      if (bVar2) {
        return false;
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffb8);
  } while( true );
}

Assistant:

bool Code::checkExtremalVertex(const int vertexIndex, const std::string &direction)
{
    auto &upEdges = upEdgesMap[direction][vertexIndex];
    auto &edges = vertexToEdges[vertexIndex];
    bool edgeInSyndrome = false;
    for (const int edgeIndex : edges)
    {
        if (syndrome[edgeIndex] == 1)
        {
            edgeInSyndrome = true;
            if (std::find(upEdges.begin(), upEdges.end(), edgeIndex) == upEdges.end())
            {
                // Edge in syndrome is not an up-edge => vertex is not extremal
                return false;
            }
        }
    }
    return edgeInSyndrome;
}